

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionHeuristics::ReorderExpressions
          (ExpressionHeuristics *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *expressions)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  pointer pEVar4;
  int iVar5;
  pointer *__ptr_1;
  reference pvVar6;
  pointer pEVar7;
  type expr;
  idx_t iVar8;
  ulong uVar9;
  pointer pEVar10;
  ulong uVar11;
  pointer *__ptr;
  __normal_iterator<ExpressionCosts_*,_std::vector<ExpressionCosts,_std::allocator<ExpressionCosts>_>_>
  __i;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__n;
  pointer pEVar12;
  long lVar13;
  pointer pEVar14;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *pvVar15;
  size_type __n_00;
  size_type sVar16;
  _Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *p_Var17;
  long lVar18;
  bool bVar19;
  vector<ExpressionCosts,_std::allocator<ExpressionCosts>_> local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  pointer local_48;
  pointer local_40;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_38;
  
  bVar19 = (expressions->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           (expressions->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar15 = expressions;
  if (bVar19) {
    pvVar15 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *)0x0;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](expressions,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0x10])(pEVar7);
    if ((char)iVar5 == '\0') {
      __n = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)&DAT_00000001;
      do {
        bVar19 = __n < (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)((long)(expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
        if (!bVar19) goto LAB_011803f9;
        pvVar15 = __n;
        pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](expressions,(size_type)__n);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0x10])(pEVar7);
        __n = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *)((long)&(__n->
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
      } while ((char)iVar5 == '\0');
    }
    if (bVar19) {
      return;
    }
  }
LAB_011803f9:
  local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var17 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
            ((long)(expressions->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(expressions->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((ulong)p_Var17 >> 0x3b != 0) {
    ::std::__throw_length_error("vector::reserve");
  }
  if (p_Var17 != (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)0x0) {
    local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ::std::_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>::_M_allocate
                   (p_Var17,(size_t)pvVar15);
    local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
         super__Vector_impl_data._M_finish + (long)p_Var17;
  }
  pEVar14 = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pEVar10 = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar16 = 0;
    local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_38 = expressions;
    do {
      pvVar15 = local_38;
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](local_38,sVar16);
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar6);
      iVar8 = Cost(expr);
      __n_00 = sVar16;
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](pvVar15,sVar16);
      pEVar4 = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      _Var1._M_head_impl =
           (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      if (local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_finish == pEVar14) {
        lVar18 = (long)local_68.
                       super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pEVar10;
        local_50._M_head_impl = _Var1._M_head_impl;
        local_48 = pEVar14;
        if (lVar18 == 0x7ffffffffffffff0) {
          local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_start = pEVar10;
          local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pEVar14;
          ::std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar9 = lVar18 >> 4;
        uVar11 = uVar9;
        if (local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
            super__Vector_impl_data._M_finish == pEVar10) {
          uVar11 = 1;
        }
        p_Var17 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
                  (uVar11 + uVar9);
        if ((_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)0x7fffffffffffffe <
            p_Var17) {
          p_Var17 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
                    0x7ffffffffffffff;
        }
        if (CARRY8(uVar11,uVar9)) {
          p_Var17 = (_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_> *)
                    0x7ffffffffffffff;
        }
        local_40 = pEVar10;
        pEVar10 = ::std::_Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>::
                  _M_allocate(p_Var17,__n_00);
        *(Expression **)((long)pEVar10 + lVar18) = local_50._M_head_impl;
        *(idx_t *)((long)pEVar10 + lVar18 + 8) = iVar8;
        pEVar12 = pEVar10;
        for (pEVar14 = local_40; pEVar4 != pEVar14; pEVar14 = pEVar14 + 1) {
          _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (pEVar14->expr).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>;
          iVar8 = pEVar14->cost;
          (pEVar14->expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
          (pEVar12->expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          pEVar12->cost = iVar8;
          (pEVar14->expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false> =
               (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
          pEVar12 = pEVar12 + 1;
        }
        if (local_40 != (pointer)0x0) {
          operator_delete(local_40);
        }
        pEVar14 = pEVar10 + (long)p_Var17;
      }
      else {
        ((local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
          super__Vector_impl_data._M_finish)->expr).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)_Var1._M_head_impl;
        (local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
         super__Vector_impl_data._M_finish)->cost = iVar8;
        pEVar12 = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
      super__Vector_impl_data._M_finish = pEVar12 + 1;
      sVar16 = sVar16 + 1;
      expressions = local_38;
    } while (sVar16 < (ulong)((long)(local_38->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_38->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pEVar4 = local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
  super__Vector_impl_data._M_start = pEVar10;
  local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pEVar14;
  if (pEVar10 !=
      local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar13 = (long)local_68.super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pEVar10;
    uVar11 = lVar13 >> 4;
    lVar18 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar10,local_68.
                       super__Vector_base<ExpressionCosts,_std::allocator<ExpressionCosts>_>._M_impl
                       .super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar13 < 0x101) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pEVar10,pEVar4);
    }
    else {
      pEVar14 = pEVar10 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pEVar10,pEVar14);
      for (; pEVar14 != pEVar4; pEVar14 = pEVar14 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts*,std::vector<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts,std::allocator<duckdb::ExpressionHeuristics::ReorderExpressions(duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>&)::ExpressionCosts>>>,__gnu_cxx::__ops::_Val_less_iter>
                  (pEVar14);
      }
    }
  }
  if ((long)pEVar4 - (long)pEVar10 != 0) {
    lVar18 = (long)pEVar4 - (long)pEVar10 >> 4;
    sVar16 = 0;
    do {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](expressions,sVar16);
      _Var1._M_head_impl =
           (pEVar10->expr).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pEVar10->expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
      ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
      _Var3._M_head_impl =
           (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var1._M_head_impl;
      if (_Var3._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
      }
      sVar16 = sVar16 + 1;
      pEVar10 = pEVar10 + 1;
    } while (lVar18 + (ulong)(lVar18 == 0) != sVar16);
  }
  ::std::vector<ExpressionCosts,_std::allocator<ExpressionCosts>_>::~vector(&local_68);
  return;
}

Assistant:

void ExpressionHeuristics::ReorderExpressions(vector<unique_ptr<Expression>> &expressions) {
	struct ExpressionCosts {
		unique_ptr<Expression> expr;
		idx_t cost;

		bool operator==(const ExpressionCosts &p) const {
			return cost == p.cost;
		}
		bool operator<(const ExpressionCosts &p) const {
			return cost < p.cost;
		}
	};

	for (idx_t i = 0; i < expressions.size(); i++) {
		if (expressions[i]->CanThrow()) {
			// do not allow reordering if an expression can throw
			return;
		}
	}

	vector<ExpressionCosts> expression_costs;
	expression_costs.reserve(expressions.size());
	// iterate expressions, get cost for each one
	for (idx_t i = 0; i < expressions.size(); i++) {
		idx_t cost = Cost(*expressions[i]);
		expression_costs.push_back({std::move(expressions[i]), cost});
	}

	// sort by cost and put back in place
	sort(expression_costs.begin(), expression_costs.end());
	for (idx_t i = 0; i < expression_costs.size(); i++) {
		expressions[i] = std::move(expression_costs[i].expr);
	}
}